

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

pair<slang::ast::SubroutineSymbol_*,_bool>
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,FunctionDeclarationSyntax *syntax,Scope *parent,bool outOfBlock)

{
  undefined1 *puVar1;
  SymbolKind SVar2;
  uint uVar3;
  FunctionPrototypeSyntax *pFVar4;
  ScopedNameSyntax *name;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bitmask<slang::ast::MethodFlags> bVar8;
  int iVar9;
  SubroutineSymbol *pSVar10;
  Diagnostic *this;
  SourceLocation noteLocation;
  undefined4 extraout_var;
  VariableSymbol *member;
  undefined7 in_register_00000009;
  Scope *pSVar11;
  Symbol **ppSVar12;
  __extent_storage<18446744073709551615UL> src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_t extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar13;
  SymbolIndex index;
  Symbol *pSVar14;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar15;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar16;
  optional<slang::ast::VariableLifetime> lifetime;
  SubroutineKind subroutineKind;
  Token nameToken;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  _Storage<slang::ast::VariableLifetime,_true> local_a8;
  bool bStack_a4;
  undefined3 uStack_a3;
  SubroutineKind local_9c;
  undefined1 local_98 [8];
  SourceLocation local_90;
  Compilation *local_88;
  Token local_80;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_70 [2];
  
  local_90 = (SourceLocation)local_98;
  pFVar4 = (syntax->prototype).ptr;
  name = (ScopedNameSyntax *)(pFVar4->name).ptr;
  if (((int)CONCAT71(in_register_00000009,outOfBlock) == 0) &&
     ((name->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName)) {
    if (parent->lastMember == (Symbol *)0x0) {
      index = 1;
    }
    else {
      index = parent->lastMember->indexInScope + 1;
    }
    if ((name->separator).kind != DoubleColon) {
      pVar16 = fromSyntax(compilation,syntax,parent,true);
      pSVar10 = pVar16.first;
      (pSVar10->super_Symbol).parentScope = parent;
      (pSVar10->super_Symbol).indexInScope = index;
      Compilation::addExternInterfaceMethod(compilation,pSVar10);
      uVar13 = CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),1);
      pSVar10 = (SubroutineSymbol *)0x0;
      goto LAB_00408549;
    }
    Compilation::addOutOfBlockDecl(compilation,parent,name,(SyntaxNode *)syntax,index);
    pSVar10 = (SubroutineSymbol *)0x0;
  }
  else {
    local_80 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)name);
    token.kind = (pFVar4->lifetime).kind;
    token._2_1_ = (pFVar4->lifetime).field_0x2;
    token.numFlags.raw = (pFVar4->lifetime).numFlags.raw;
    token.rawLen = (pFVar4->lifetime).rawLen;
    token.info = (pFVar4->lifetime).info;
    _local_a8 = (_Optional_payload_base<slang::ast::VariableLifetime>)
                SemanticFacts::getVariableLifetime(token);
    if (((ulong)_local_a8 >> 0x20 & 1) == 0) {
      local_a8 = (_Storage<slang::ast::VariableLifetime,_true>)0x1;
      bStack_a4 = true;
      uStack_a3 = 0;
      pSVar11 = parent;
      do {
        pSVar14 = pSVar11->thisSym;
        SVar2 = pSVar14->kind;
        if (SVar2 == ClassType) {
          local_a8 = (_Storage<slang::ast::VariableLifetime,_true>)0x0;
          bStack_a4 = true;
          uStack_a3 = 0;
          break;
        }
        if (SVar2 == Package) {
          uVar3 = (uint)pSVar14[2].name._M_len;
LAB_0040829a:
          _local_a8 = (_Optional_payload_base<slang::ast::VariableLifetime>)
                      ((ulong)uVar3 | 0x100000000);
          break;
        }
        if (SVar2 == InstanceBody) {
          uVar3 = *(uint *)(pSVar14[2].name._M_str + 0x4c);
          goto LAB_0040829a;
        }
        pSVar11 = pSVar14->parentScope;
      } while (pSVar11 != (Scope *)0x0);
    }
    local_9c = (SubroutineKind)
               ((syntax->super_MemberSyntax).super_SyntaxNode.kind == TaskDeclaration);
    local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&local_80);
    local_98 = (undefined1  [8])parsing::Token::location(&local_80);
    pSVar10 = BumpAllocator::
              emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::SubroutineKind&>
                        (&compilation->super_BumpAllocator,compilation,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_70,
                         (SourceLocation *)local_98,&local_a8._M_value,&local_9c);
    (pSVar10->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&pSVar10->super_Symbol,parent,syntax_00);
    local_70[0].len = 0;
    local_70[0].data_ = (pointer)((long)local_70 + 0x18);
    local_70[0].cap = 5;
    if (pFVar4->portList != (FunctionPortListSyntax *)0x0) {
      bVar8 = buildArguments(&pSVar10->super_Scope,parent,pFVar4->portList,local_a8._M_value,
                             local_70);
      (pSVar10->flags).m_bits = (pSVar10->flags).m_bits | bVar8.m_bits;
    }
    local_88 = compilation;
    if (local_80.kind == NewKeyword) {
      *(byte *)&(pSVar10->flags).m_bits = (byte)(pSVar10->flags).m_bits | 8;
LAB_0040837c:
      (pSVar10->declaredReturnType).type = compilation->voidType;
    }
    else {
      if (local_9c != Function) goto LAB_0040837c;
      auVar6._12_4_ = 0;
      auVar6._0_12_ = stack0xffffffffffffff6c;
      _local_98 = (Token)(auVar6 << 0x20);
      member = BumpAllocator::
               emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                         (&compilation->super_BumpAllocator,&(pSVar10->super_Symbol).name,
                          &(pSVar10->super_Symbol).location,(VariableLifetime *)local_98);
      (member->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar4->returnType).ptr;
      puVar1 = &(member->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      *(byte *)&(member->flags).m_bits = (byte)(member->flags).m_bits | 2;
      Scope::insertMember(&pSVar10->super_Scope,(Symbol *)member,(pSVar10->super_Scope).lastMember,
                          false,true);
      pSVar10->returnValVar = member;
      (pSVar10->declaredReturnType).typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar4->returnType).ptr;
      puVar1 = &(pSVar10->declaredReturnType).field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
    }
    pSVar14 = (pSVar10->super_Scope).lastMember;
    sVar15 = Statement::createAndAddBlockItems(&pSVar10->super_Scope,&syntax->items);
    src = sVar15._M_extent._M_extent_value;
    pSVar10->blocks = sVar15;
    ppSVar12 = &(pSVar10->super_Scope).firstMember;
    if (pSVar14 != (Symbol *)0x0) {
      ppSVar12 = &pSVar14->nextInScope;
    }
    pSVar14 = *ppSVar12;
    if (pSVar14 != (Symbol *)0x0) {
      bVar7 = false;
      do {
        if (pSVar14->kind == FormalArgument) {
          bVar5 = !bVar7;
          bVar7 = true;
          if (bVar5) {
            if (pFVar4->portList == (FunctionPortListSyntax *)0x0) {
              bVar7 = false;
            }
            else {
              this = Scope::addDiag(parent,(DiagCode)0x810006,pSVar14->location);
              _local_98 = slang::syntax::SyntaxNode::getFirstToken
                                    (&pFVar4->portList->super_SyntaxNode);
              noteLocation = parsing::Token::location((Token *)local_98);
              Diagnostic::addNote(this,(DiagCode)0x50001,noteLocation);
            }
          }
          local_98 = (undefined1  [8])pSVar14;
          SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
          emplace_back<slang::ast::FormalArgumentSymbol_const*>
                    ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)local_70,
                     (FormalArgumentSymbol **)local_98);
          src._M_extent_value = (size_t)extraout_RDX;
          if (((bStack_a4 == true) && (local_a8._M_value == Static)) &&
             (*(int *)&pSVar14[5].location == 3)) {
            Scope::addDiag(parent,(DiagCode)0xbb0006,pSVar14->location);
            src._M_extent_value = (size_t)extraout_RDX_00;
          }
        }
        pSVar14 = pSVar14->nextInScope;
      } while (pSVar14 != (Symbol *)0x0);
    }
    iVar9 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_70,(EVP_PKEY_CTX *)local_88,(EVP_PKEY_CTX *)src._M_extent_value);
    (pSVar10->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar9);
    (pSVar10->arguments)._M_extent._M_extent_value = extraout_RDX_01;
    if (local_70[0].data_ != (pointer)((long)local_70 + 0x18U)) {
      operator_delete(local_70[0].data_);
    }
  }
  uVar13 = 0;
LAB_00408549:
  pVar16._8_8_ = uVar13;
  pVar16.first = pSVar10;
  return pVar16;
}

Assistant:

std::pair<SubroutineSymbol*, bool> SubroutineSymbol::fromSyntax(
    Compilation& compilation, const FunctionDeclarationSyntax& syntax, const Scope& parent,
    bool outOfBlock) {

    // If this subroutine has a scoped name, it should be an out of block declaration.
    // We shouldn't create a symbol now, since we need the class prototype to hook
    // us in to the correct scope. Register this syntax with the compilation so that
    // it can later be found by the prototype.
    auto proto = syntax.prototype;
    if (!outOfBlock && proto->name->kind == SyntaxKind::ScopedName) {
        // Remember the location in the parent scope where we *would* have inserted this
        // subroutine, for later use during lookup.
        uint32_t index = 1;
        if (auto last = parent.getLastMember())
            index = (uint32_t)last->getIndex() + 1;

        bool isExternIfaceMethod = false;
        auto& scopedName = proto->name->as<ScopedNameSyntax>();
        if (scopedName.separator.kind == TokenKind::DoubleColon) {
            // This is an out-of-block class method implementation.
            compilation.addOutOfBlockDecl(parent, scopedName, syntax, SymbolIndex(index));
        }
        else {
            // Otherwise this is an interface method implementation.
            // We should create the method like normal but not add it to
            // the parent name map (because it can only be looked up via
            // the interface instance).
            auto [result, _] = SubroutineSymbol::fromSyntax(compilation, syntax, parent,
                                                            /* outOfBlock */ true);
            SLANG_ASSERT(result);

            result->setParent(parent, SymbolIndex(index));
            compilation.addExternInterfaceMethod(*result);
            isExternIfaceMethod = true;
        }
        return {nullptr, isExternIfaceMethod};
    }

    Token nameToken = proto->name->getLastToken();
    auto lifetime = SemanticFacts::getVariableLifetime(proto->lifetime);
    if (!lifetime.has_value()) {
        // Walk up to the nearest instance and use its default lifetime.
        // If we're not within an instance, default to static.
        lifetime = VariableLifetime::Static;
        auto scope = &parent;
        do {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody) {
                lifetime = sym.as<InstanceBodySymbol>().getDefinition().defaultLifetime;
                break;
            }
            else if (sym.kind == SymbolKind::ClassType) {
                lifetime = VariableLifetime::Automatic;
                break;
            }
            else if (sym.kind == SymbolKind::Package) {
                lifetime = sym.as<PackageSymbol>().defaultLifetime;
                break;
            }
            scope = sym.getParentScope();
        } while (scope);
    }

    auto subroutineKind = syntax.kind == SyntaxKind::TaskDeclaration ? SubroutineKind::Task
                                                                     : SubroutineKind::Function;
    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(), *lifetime,
                                                        subroutineKind);

    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto->portList)
        result->flags |= buildArguments(*result, parent, *proto->portList, *lifetime, arguments);

    if (nameToken.kind == TokenKind::NewKeyword) {
        result->flags |= MethodFlags::Constructor;
        result->declaredReturnType.setType(compilation.getVoidType());
    }
    else if (subroutineKind == SubroutineKind::Function) {
        // The function gets an implicit variable inserted that represents the return value.
        auto implicitReturnVar = compilation.emplace<VariableSymbol>(result->name, result->location,
                                                                     VariableLifetime::Automatic);
        implicitReturnVar->setDeclaredType(*proto->returnType);
        implicitReturnVar->flags |= VariableFlags::CompilerGenerated;
        result->addMember(*implicitReturnVar);
        result->returnValVar = implicitReturnVar;
        result->declaredReturnType.setTypeSyntax(*proto->returnType);
    }
    else {
        result->declaredReturnType.setType(compilation.getVoidType());
    }

    const Symbol* last = result->getLastMember();
    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);

    // Subroutines can also declare arguments inside their bodies as port declarations.
    // Find them by walking through members that were added by setItems().
    if (!last)
        last = result->getFirstMember();
    else
        last = last->getNextSibling();

    bool portListError = false;
    while (last) {
        if (last->kind == SymbolKind::FormalArgument) {
            if (!portListError && proto->portList) {
                auto& diag = parent.addDiag(diag::MixingSubroutinePortKinds, last->location);
                diag.addNote(diag::NoteDeclarationHere,
                             proto->portList->getFirstToken().location());
                portListError = true;
            }

            auto& arg = last->as<FormalArgumentSymbol>();
            arguments.push_back(&arg);

            if (lifetime == VariableLifetime::Static && arg.direction == ArgumentDirection::Ref)
                parent.addDiag(diag::RefArgAutomaticFunc, last->location);
        }
        last = last->getNextSibling();
    }

    result->arguments = arguments.copy(compilation);
    return {result, false};
}